

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_appender.cpp
# Opt level: O3

unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true> __thiscall
duckdb::ArrowAppender::InitializeChild
          (ArrowAppender *this,LogicalType *type,idx_t capacity,ClientProperties *options,
          shared_ptr<duckdb::ArrowTypeExtensionData,_true> *extension_type)

{
  ArrowOffsetSize AVar1;
  initialize_t p_Var2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ArrowAppendData *this_00;
  ArrowTypeExtensionData *this_01;
  type pAVar5;
  pointer pAVar6;
  reference this_02;
  NotImplementedException *this_03;
  InternalException *pIVar7;
  code *pcVar8;
  string local_88;
  LogicalType local_68;
  string local_50;
  
  this_00 = (ArrowAppendData *)operator_new(0x148);
  ArrowAppendData::ArrowAppendData(this_00,options);
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this_00;
  LogicalType::LogicalType(&local_68,type);
  if ((extension_type->internal).
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    this_01 = shared_ptr<duckdb::ArrowTypeExtensionData,_true>::operator->(extension_type);
    ArrowTypeExtensionData::GetInternalType((LogicalType *)&local_88,this_01);
    _Var4._M_pi = local_68.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    peVar3 = local_68.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_68.id_ = (LogicalTypeId)local_88._M_dataplus._M_p;
    local_68.physical_type_ = local_88._M_dataplus._M_p._1_1_;
    local_68.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_88._M_string_length;
    local_68.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.field_2._M_allocated_capacity;
    local_88._M_string_length = (size_type)peVar3;
    local_88.field_2._M_allocated_capacity = (size_type)_Var4._M_pi;
    LogicalType::~LogicalType((LogicalType *)&local_88);
  }
  pAVar5 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator*((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                      *)this);
  switch(local_68.id_) {
  case SQLNULL:
    pAVar5->initialize = ArrowNullData::Initialize;
    pAVar5->append_vector = ArrowNullData::Append;
    pcVar8 = ArrowNullData::Finalize;
    break;
  case UNKNOWN:
  case ANY:
  case USER:
  case USER|SQLNULL:
  case USER|UNKNOWN:
  case USER|ANY:
  case 8:
  case 9:
  case CHAR:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
switchD_00a9c233_caseD_2:
    this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Unsupported type in DuckDB -> Arrow Conversion: %s\n","");
    LogicalType::ToString_abi_cxx11_(&local_50,&local_68);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_03,&local_88,&local_50);
    __cxa_throw(this_03,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case BOOLEAN:
    pAVar5->initialize = ArrowBoolData::Initialize;
    pAVar5->append_vector = ArrowBoolData::Append;
    pcVar8 = ArrowBoolData::Finalize;
    break;
  case TINYINT:
    pAVar5->initialize =
         ArrowScalarData<signed_char,_signed_char,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar5->append_vector =
         ArrowScalarBaseData<signed_char,_signed_char,_duckdb::ArrowScalarConverter>::Append;
    pcVar8 = ArrowScalarData<signed_char,_signed_char,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case SMALLINT:
    pAVar5->initialize = ArrowScalarData<short,_short,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar5->append_vector = ArrowScalarBaseData<short,_short,_duckdb::ArrowScalarConverter>::Append;
    pcVar8 = ArrowScalarData<short,_short,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case INTEGER:
  case DATE:
    pAVar5->initialize = ArrowScalarData<int,_int,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar5->append_vector = ArrowScalarBaseData<int,_int,_duckdb::ArrowScalarConverter>::Append;
    pcVar8 = ArrowScalarData<int,_int,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case DECIMAL:
    if (local_68.physical_type_ < INT64) {
      if (local_68.physical_type_ == INT16) {
        pAVar5->initialize =
             ArrowScalarData<duckdb::hugeint_t,_short,_duckdb::ArrowScalarConverter>::Initialize;
        pAVar5->append_vector =
             ArrowScalarBaseData<duckdb::hugeint_t,_short,_duckdb::ArrowScalarConverter>::Append;
        pcVar8 = ArrowScalarData<duckdb::hugeint_t,_short,_duckdb::ArrowScalarConverter>::Finalize;
      }
      else {
        if (local_68.physical_type_ != INT32) goto LAB_00a9c8fd;
        pAVar5->initialize =
             ArrowScalarData<duckdb::hugeint_t,_int,_duckdb::ArrowScalarConverter>::Initialize;
        pAVar5->append_vector =
             ArrowScalarBaseData<duckdb::hugeint_t,_int,_duckdb::ArrowScalarConverter>::Append;
        pcVar8 = ArrowScalarData<duckdb::hugeint_t,_int,_duckdb::ArrowScalarConverter>::Finalize;
      }
      break;
    }
    if (local_68.physical_type_ == INT64) {
      pAVar5->initialize =
           ArrowScalarData<duckdb::hugeint_t,_long,_duckdb::ArrowScalarConverter>::Initialize;
      pAVar5->append_vector =
           ArrowScalarBaseData<duckdb::hugeint_t,_long,_duckdb::ArrowScalarConverter>::Append;
      pcVar8 = ArrowScalarData<duckdb::hugeint_t,_long,_duckdb::ArrowScalarConverter>::Finalize;
      break;
    }
    if (local_68.physical_type_ != INT128) {
LAB_00a9c8fd:
      pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Unsupported internal decimal type","");
      InternalException::InternalException(pIVar7,&local_88);
      __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  case HUGEINT:
    pAVar5->initialize =
         ArrowScalarData<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::ArrowScalarConverter>::
         Initialize;
    pAVar5->append_vector =
         ArrowScalarBaseData<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::ArrowScalarConverter>::
         Append;
    pcVar8 = ArrowScalarData<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::ArrowScalarConverter>::
             Finalize;
    break;
  case FLOAT:
    pAVar5->initialize = ArrowScalarData<float,_float,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar5->append_vector = ArrowScalarBaseData<float,_float,_duckdb::ArrowScalarConverter>::Append;
    pcVar8 = ArrowScalarData<float,_float,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case DOUBLE:
    pAVar5->initialize = ArrowScalarData<double,_double,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar5->append_vector =
         ArrowScalarBaseData<double,_double,_duckdb::ArrowScalarConverter>::Append;
    pcVar8 = ArrowScalarData<double,_double,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case VARCHAR:
    if ((pAVar5->options).produce_arrow_string_view == true) {
      pAVar5->initialize = ArrowVarcharToStringViewData::Initialize;
      pAVar5->append_vector = ArrowVarcharToStringViewData::Append;
      pcVar8 = ArrowVarcharToStringViewData::Finalize;
      break;
    }
  case BLOB:
  case BIT:
  case VARINT:
    if ((pAVar5->options).arrow_offset_size == LARGE) {
      pAVar5->initialize =
           ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_long>::Initialize;
      pAVar5->append_vector =
           ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_long>::Append;
      pcVar8 = ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_long>::Finalize;
    }
    else {
      pAVar5->initialize =
           ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_int>::Initialize;
      pAVar5->append_vector =
           ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_int>::Append;
      pcVar8 = ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_int>::Finalize;
    }
    break;
  case INTERVAL:
    pAVar5->initialize =
         ArrowScalarData<duckdb::ArrowInterval,_duckdb::interval_t,_duckdb::ArrowIntervalConverter>
         ::Initialize;
    pAVar5->append_vector =
         ArrowScalarBaseData<duckdb::ArrowInterval,_duckdb::interval_t,_duckdb::ArrowIntervalConverter>
         ::Append;
    pcVar8 = ArrowScalarData<duckdb::ArrowInterval,_duckdb::interval_t,_duckdb::ArrowIntervalConverter>
             ::Finalize;
    break;
  case UTINYINT:
    pAVar5->initialize =
         ArrowScalarData<unsigned_char,_unsigned_char,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar5->append_vector =
         ArrowScalarBaseData<unsigned_char,_unsigned_char,_duckdb::ArrowScalarConverter>::Append;
    pcVar8 = ArrowScalarData<unsigned_char,_unsigned_char,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case USMALLINT:
    pAVar5->initialize =
         ArrowScalarData<unsigned_short,_unsigned_short,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar5->append_vector =
         ArrowScalarBaseData<unsigned_short,_unsigned_short,_duckdb::ArrowScalarConverter>::Append;
    pcVar8 = ArrowScalarData<unsigned_short,_unsigned_short,_duckdb::ArrowScalarConverter>::Finalize
    ;
    break;
  case UINTEGER:
    pAVar5->initialize =
         ArrowScalarData<unsigned_int,_unsigned_int,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar5->append_vector =
         ArrowScalarBaseData<unsigned_int,_unsigned_int,_duckdb::ArrowScalarConverter>::Append;
    pcVar8 = ArrowScalarData<unsigned_int,_unsigned_int,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case UBIGINT:
    pAVar5->initialize =
         ArrowScalarData<unsigned_long,_unsigned_long,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar5->append_vector =
         ArrowScalarBaseData<unsigned_long,_unsigned_long,_duckdb::ArrowScalarConverter>::Append;
    pcVar8 = ArrowScalarData<unsigned_long,_unsigned_long,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case TIME_TZ:
    if ((pAVar5->options).arrow_lossless_conversion != true) {
      pAVar5->initialize =
           ArrowScalarData<long,_duckdb::dtime_tz_t,_duckdb::ArrowTimeTzConverter>::Initialize;
      pAVar5->append_vector =
           ArrowScalarBaseData<long,_duckdb::dtime_tz_t,_duckdb::ArrowTimeTzConverter>::Append;
      pcVar8 = ArrowScalarData<long,_duckdb::dtime_tz_t,_duckdb::ArrowTimeTzConverter>::Finalize;
      break;
    }
  case BIGINT:
  case TIME:
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_NS:
  case TIMESTAMP_TZ:
    pAVar5->initialize = ArrowScalarData<long,_long,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar5->append_vector = ArrowScalarBaseData<long,_long,_duckdb::ArrowScalarConverter>::Append;
    pcVar8 = ArrowScalarData<long,_long,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case UHUGEINT:
    pAVar5->initialize =
         ArrowScalarData<duckdb::uhugeint_t,_duckdb::uhugeint_t,_duckdb::ArrowScalarConverter>::
         Initialize;
    pAVar5->append_vector =
         ArrowScalarBaseData<duckdb::uhugeint_t,_duckdb::uhugeint_t,_duckdb::ArrowScalarConverter>::
         Append;
    pcVar8 = ArrowScalarData<duckdb::uhugeint_t,_duckdb::uhugeint_t,_duckdb::ArrowScalarConverter>::
             Finalize;
    break;
  case UUID:
    if ((pAVar5->options).arrow_lossless_conversion == true) {
      pAVar5->initialize =
           ArrowScalarData<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::ArrowUUIDBlobConverter>::
           Initialize;
      pAVar5->append_vector =
           ArrowScalarBaseData<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::ArrowUUIDBlobConverter>
           ::Append;
      pcVar8 = ArrowScalarData<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::ArrowUUIDBlobConverter>
               ::Finalize;
    }
    else if ((pAVar5->options).arrow_offset_size == LARGE) {
      pAVar5->initialize =
           ArrowVarcharData<duckdb::hugeint_t,_duckdb::ArrowUUIDConverter,_long>::Initialize;
      pAVar5->append_vector =
           ArrowVarcharData<duckdb::hugeint_t,_duckdb::ArrowUUIDConverter,_long>::Append;
      pcVar8 = ArrowVarcharData<duckdb::hugeint_t,_duckdb::ArrowUUIDConverter,_long>::Finalize;
    }
    else {
      pAVar5->initialize =
           ArrowVarcharData<duckdb::hugeint_t,_duckdb::ArrowUUIDConverter,_int>::Initialize;
      pAVar5->append_vector =
           ArrowVarcharData<duckdb::hugeint_t,_duckdb::ArrowUUIDConverter,_int>::Append;
      pcVar8 = ArrowVarcharData<duckdb::hugeint_t,_duckdb::ArrowUUIDConverter,_int>::Finalize;
    }
    break;
  default:
    switch(local_68.id_) {
    case STRUCT:
      pAVar5->initialize = ArrowStructData::Initialize;
      pAVar5->append_vector = ArrowStructData::Append;
      pcVar8 = ArrowStructData::Finalize;
      break;
    case LIST:
      AVar1 = (pAVar5->options).arrow_offset_size;
      if ((pAVar5->options).arrow_use_list_view == true) {
        if (AVar1 == LARGE) {
          pAVar5->initialize = ArrowListViewData<long>::Initialize;
          pAVar5->append_vector = ArrowListViewData<long>::Append;
          pcVar8 = ArrowListViewData<long>::Finalize;
        }
        else {
          pAVar5->initialize = ArrowListViewData<int>::Initialize;
          pAVar5->append_vector = ArrowListViewData<int>::Append;
          pcVar8 = ArrowListViewData<int>::Finalize;
        }
      }
      else if (AVar1 == LARGE) {
        pAVar5->initialize = ArrowListData<long>::Initialize;
        pAVar5->append_vector = ArrowListData<long>::Append;
        pcVar8 = ArrowListData<long>::Finalize;
      }
      else {
        pAVar5->initialize = ArrowListData<int>::Initialize;
        pAVar5->append_vector = ArrowListData<int>::Append;
        pcVar8 = ArrowListData<int>::Finalize;
      }
      break;
    case MAP:
      pAVar5->initialize = ArrowMapData<int>::Initialize;
      pAVar5->append_vector = ArrowMapData<int>::Append;
      pcVar8 = ArrowMapData<int>::Finalize;
      break;
    default:
      goto switchD_00a9c233_caseD_2;
    case ENUM:
      if (local_68.physical_type_ == UINT32) {
        pAVar5->initialize = ArrowEnumData<int>::Initialize;
        pAVar5->append_vector = ArrowScalarBaseData<int,_int,_duckdb::ArrowScalarConverter>::Append;
        pcVar8 = ArrowEnumData<int>::Finalize;
      }
      else if (local_68.physical_type_ == UINT16) {
        pAVar5->initialize = ArrowEnumData<short>::Initialize;
        pAVar5->append_vector =
             ArrowScalarBaseData<short,_short,_duckdb::ArrowScalarConverter>::Append;
        pcVar8 = ArrowEnumData<short>::Finalize;
      }
      else {
        if (local_68.physical_type_ != UINT8) {
          pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"Unsupported internal enum type","");
          InternalException::InternalException(pIVar7,&local_88);
          __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pAVar5->initialize = ArrowEnumData<signed_char>::Initialize;
        pAVar5->append_vector =
             ArrowScalarBaseData<signed_char,_signed_char,_duckdb::ArrowScalarConverter>::Append;
        pcVar8 = ArrowEnumData<signed_char>::Finalize;
      }
      break;
    case UNION:
      pAVar5->initialize = ArrowUnionData::Initialize;
      pAVar5->append_vector = ArrowUnionData::Append;
      pcVar8 = ArrowUnionData::Finalize;
      break;
    case ARRAY:
      pAVar5->initialize = ArrowFixedSizeListData::Initialize;
      pAVar5->append_vector = ArrowFixedSizeListData::Append;
      pcVar8 = ArrowFixedSizeListData::Finalize;
    }
  }
  pAVar5->finalize = pcVar8;
  pAVar6 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator->((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                       *)this);
  shared_ptr<duckdb::ArrowTypeExtensionData,_true>::operator=
            (&pAVar6->extension_data,extension_type);
  pAVar6 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator->((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                       *)this);
  this_02 = vector<duckdb::ArrowBuffer,_true>::operator[](&pAVar6->arrow_buffers,0);
  ArrowBuffer::reserve(this_02,capacity + 7 >> 3);
  pAVar6 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator->((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                       *)this);
  p_Var2 = pAVar6->initialize;
  pAVar5 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator*((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                      *)this);
  (*p_Var2)(pAVar5,&local_68,capacity);
  LogicalType::~LogicalType(&local_68);
  return (unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)
         (unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)this;
}

Assistant:

unique_ptr<ArrowAppendData> ArrowAppender::InitializeChild(const LogicalType &type, const idx_t capacity,
                                                           ClientProperties &options,
                                                           const shared_ptr<ArrowTypeExtensionData> &extension_type) {
	auto result = make_uniq<ArrowAppendData>(options);
	LogicalType array_type = type;
	if (extension_type) {
		array_type = extension_type->GetInternalType();
	}
	InitializeFunctionPointers(*result, array_type);
	result->extension_data = extension_type;

	const auto byte_count = (capacity + 7) / 8;
	result->GetValidityBuffer().reserve(byte_count);
	result->initialize(*result, array_type, capacity);
	return result;
}